

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O3

void YP_md_request_device_dump(YPSpur *spur,int id,int block)

{
  int iVar1;
  YPSpur_msg msg;
  YPSpur_msg local_40;
  
  local_40.msg_type = 1;
  local_40.pid = (long)spur->pid;
  local_40.type = 0x504;
  local_40.cs = 0;
  local_40.data[0] = (double)id;
  local_40.data[1] = (double)block;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_40);
  if (iVar1 < 0) {
    spur->connection_error = 1;
  }
  return;
}

Assistant:

void YP_md_request_device_dump(YPSpur* spur, int id, int block)
{
  YPSpur_msg msg;
  int len;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_REQUEST_DEVICE_DUMP;
  msg.data[0] = id;
  msg.data[1] = block;
  msg.cs = 0;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
  }
}